

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

_Bool spell_cast(wchar_t spell_index,wchar_t dir,command *cmd)

{
  uint32_t *puVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  effect *effect;
  _Bool _Var5;
  int16_t iVar6;
  short sVar7;
  uint32_t uVar8;
  class_spell_conflict *pcVar9;
  int iVar10;
  player *p;
  source origin;
  source sVar11;
  _Bool ident;
  wchar_t local_3c;
  command *local_38;
  
  ident = false;
  sVar3 = player->lev;
  local_3c = dir;
  local_38 = cmd;
  _Var5 = flag_has_dbg((player->state).pflags,3,5,"player->state.pflags","(PF_BEAM)");
  pcVar9 = spell_by_index(player,spell_index);
  iVar6 = spell_chance(spell_index);
  uVar8 = Rand_div(100);
  if ((int)uVar8 < (int)iVar6) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("You failed to concentrate hard enough!");
    p = player;
  }
  else {
    sVar7 = sVar3 / 2;
    if (_Var5) {
      sVar7 = sVar3;
    }
    effect = pcVar9->effect;
    sVar11 = source_player();
    origin.which = sVar11.which;
    origin._4_4_ = 0;
    origin.what = sVar11.what;
    _Var5 = effect_do(effect,origin,(object *)0x0,&ident,true,local_3c,(int)sVar7,L'\0',local_38);
    if (!_Var5) {
      return false;
    }
    _Var5 = flag_has_dbg((player->state).pflags,3,0x11,"player->state.pflags","(PF_COMBAT_REGEN)");
    if (_Var5) {
      convert_mana_to_hp(player,pcVar9->smana << 0x10);
    }
    sound(0x92);
    bVar2 = player->spell_flags[spell_index];
    p = player;
    if ((bVar2 & 2) == 0) {
      iVar4 = pcVar9->sexp;
      player->spell_flags[spell_index] = bVar2 | 2;
      player_exp_gain(player,iVar4 * pcVar9->slevel);
      p = player;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x200000;
    }
  }
  iVar4 = pcVar9->smana;
  sVar3 = p->csp;
  iVar10 = iVar4 - sVar3;
  if (iVar10 == 0 || iVar4 < sVar3) {
    p->csp = sVar3 - (short)iVar4;
  }
  else {
    p->csp = 0;
    p->csp_frac = 0;
    player_over_exert(p,L'\x02',L'd',iVar10 * 5 + L'\x01');
    player_over_exert(player,L'\x01',L'2',L'\0');
    p = player;
  }
  puVar1 = &p->upkeep->redraw;
  *puVar1 = *puVar1 | 0x80;
  return true;
}

Assistant:

bool spell_cast(int spell_index, int dir, struct command *cmd)
{
	int chance;
	bool ident = false;
	int beam  = beam_chance();

	/* Get the spell */
	const struct class_spell *spell = spell_by_index(player, spell_index);

	/* Spell failure chance */
	chance = spell_chance(spell_index);

	/* Fail or succeed */
	if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to concentrate hard enough!");
	} else {
		/* Cast the spell */
		if (!effect_do(spell->effect, source_player(), NULL, &ident, true, dir,
					   beam, 0, cmd)) {
			return false;
		}

		/* Reward COMBAT_REGEN with small HP recovery */
		if (player_has(player, PF_COMBAT_REGEN)) {
			convert_mana_to_hp(player, spell->smana << 16);
		}

		/* A spell was cast */
		sound(MSG_SPELL);

		if (!(player->spell_flags[spell_index] & PY_SPELL_WORKED)) {
			int e = spell->sexp;

			/* The spell worked */
			player->spell_flags[spell_index] |= PY_SPELL_WORKED;

			/* Gain experience */
			player_exp_gain(player, e * spell->slevel);

			/* Redraw object recall */
			player->upkeep->redraw |= (PR_OBJECT);
		}
	}

	/* Sufficient mana? */
	if (spell->smana <= player->csp) {
		/* Use some mana */
		player->csp -= spell->smana;
	} else {
		int oops = spell->smana - player->csp;

		/* No mana left */
		player->csp = 0;
		player->csp_frac = 0;

		/* Over-exert the player */
		player_over_exert(player, PY_EXERT_FAINT, 100, 5 * oops + 1);
		player_over_exert(player, PY_EXERT_CON, 50, 0);
	}

	/* Redraw mana */
	player->upkeep->redraw |= (PR_MANA);

	return true;
}